

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::Builder(Builder *this,VersionSet *vset,Version *base)

{
  set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
  *this_00;
  LevelState *local_48;
  allocator<leveldb::FileMetaData_*> local_3d [17];
  int local_2c;
  BySmallestKey BStack_28;
  int level;
  BySmallestKey cmp;
  Version *base_local;
  VersionSet *vset_local;
  Builder *this_local;
  
  this->vset_ = vset;
  this->base_ = base;
  local_48 = this->levels_;
  cmp.internal_comparator = (InternalKeyComparator *)base;
  do {
    LevelState::LevelState(local_48);
    local_48 = local_48 + 1;
  } while ((Builder *)local_48 != this + 1);
  Version::Ref(this->base_);
  BStack_28.internal_comparator = &this->vset_->icmp_;
  for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
    this_00 = (set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
               *)operator_new(0x30);
    std::allocator<leveldb::FileMetaData_*>::allocator(local_3d);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::set(this_00,&stack0xffffffffffffffd8,local_3d);
    this->levels_[local_2c].added_files = this_00;
    std::allocator<leveldb::FileMetaData_*>::~allocator(local_3d);
  }
  return;
}

Assistant:

Builder(VersionSet* vset, Version* base) : vset_(vset), base_(base) {
    base_->Ref();
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      levels_[level].added_files = new FileSet(cmp);
    }
  }